

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderLibrary.cpp
# Opt level: O0

DataType __thiscall glu::sl::ShaderParser::mapDataTypeToken(ShaderParser *this,Token token)

{
  Token token_local;
  ShaderParser *this_local;
  
  switch(token) {
  case TOKEN_FLOAT:
    this_local._4_4_ = TYPE_FLOAT;
    break;
  case TOKEN_FLOAT_VEC2:
    this_local._4_4_ = TYPE_FLOAT_VEC2;
    break;
  case TOKEN_FLOAT_VEC3:
    this_local._4_4_ = TYPE_FLOAT_VEC3;
    break;
  case TOKEN_FLOAT_VEC4:
    this_local._4_4_ = TYPE_FLOAT_VEC4;
    break;
  case TOKEN_FLOAT_MAT2:
    this_local._4_4_ = TYPE_FLOAT_MAT2;
    break;
  case TOKEN_FLOAT_MAT2X3:
    this_local._4_4_ = TYPE_FLOAT_MAT2X3;
    break;
  case TOKEN_FLOAT_MAT2X4:
    this_local._4_4_ = TYPE_FLOAT_MAT2X4;
    break;
  case TOKEN_FLOAT_MAT3X2:
    this_local._4_4_ = TYPE_FLOAT_MAT3X2;
    break;
  case TOKEN_FLOAT_MAT3:
    this_local._4_4_ = TYPE_FLOAT_MAT3;
    break;
  case TOKEN_FLOAT_MAT3X4:
    this_local._4_4_ = TYPE_FLOAT_MAT3X4;
    break;
  case TOKEN_FLOAT_MAT4X2:
    this_local._4_4_ = TYPE_FLOAT_MAT4X2;
    break;
  case TOKEN_FLOAT_MAT4X3:
    this_local._4_4_ = TYPE_FLOAT_MAT4X3;
    break;
  case TOKEN_FLOAT_MAT4:
    this_local._4_4_ = TYPE_FLOAT_MAT4;
    break;
  case TOKEN_INT:
    this_local._4_4_ = TYPE_INT;
    break;
  case TOKEN_INT_VEC2:
    this_local._4_4_ = TYPE_INT_VEC2;
    break;
  case TOKEN_INT_VEC3:
    this_local._4_4_ = TYPE_INT_VEC3;
    break;
  case TOKEN_INT_VEC4:
    this_local._4_4_ = TYPE_INT_VEC4;
    break;
  case TOKEN_UINT:
    this_local._4_4_ = TYPE_UINT;
    break;
  case TOKEN_UINT_VEC2:
    this_local._4_4_ = TYPE_UINT_VEC2;
    break;
  case TOKEN_UINT_VEC3:
    this_local._4_4_ = TYPE_UINT_VEC3;
    break;
  case TOKEN_UINT_VEC4:
    this_local._4_4_ = TYPE_UINT_VEC4;
    break;
  case TOKEN_BOOL:
    this_local._4_4_ = TYPE_BOOL;
    break;
  case TOKEN_BOOL_VEC2:
    this_local._4_4_ = TYPE_BOOL_VEC2;
    break;
  case TOKEN_BOOL_VEC3:
    this_local._4_4_ = TYPE_BOOL_VEC3;
    break;
  case TOKEN_BOOL_VEC4:
    this_local._4_4_ = TYPE_BOOL_VEC4;
    break;
  default:
    this_local._4_4_ = TYPE_INVALID;
  }
  return this_local._4_4_;
}

Assistant:

DataType ShaderParser::mapDataTypeToken (Token token)
{
	switch (token)
	{
		case TOKEN_FLOAT:			return TYPE_FLOAT;
		case TOKEN_FLOAT_VEC2:		return TYPE_FLOAT_VEC2;
		case TOKEN_FLOAT_VEC3:		return TYPE_FLOAT_VEC3;
		case TOKEN_FLOAT_VEC4:		return TYPE_FLOAT_VEC4;
		case TOKEN_FLOAT_MAT2:		return TYPE_FLOAT_MAT2;
		case TOKEN_FLOAT_MAT2X3:	return TYPE_FLOAT_MAT2X3;
		case TOKEN_FLOAT_MAT2X4:	return TYPE_FLOAT_MAT2X4;
		case TOKEN_FLOAT_MAT3X2:	return TYPE_FLOAT_MAT3X2;
		case TOKEN_FLOAT_MAT3:		return TYPE_FLOAT_MAT3;
		case TOKEN_FLOAT_MAT3X4:	return TYPE_FLOAT_MAT3X4;
		case TOKEN_FLOAT_MAT4X2:	return TYPE_FLOAT_MAT4X2;
		case TOKEN_FLOAT_MAT4X3:	return TYPE_FLOAT_MAT4X3;
		case TOKEN_FLOAT_MAT4:		return TYPE_FLOAT_MAT4;
		case TOKEN_INT:				return TYPE_INT;
		case TOKEN_INT_VEC2:		return TYPE_INT_VEC2;
		case TOKEN_INT_VEC3:		return TYPE_INT_VEC3;
		case TOKEN_INT_VEC4:		return TYPE_INT_VEC4;
		case TOKEN_UINT:			return TYPE_UINT;
		case TOKEN_UINT_VEC2:		return TYPE_UINT_VEC2;
		case TOKEN_UINT_VEC3:		return TYPE_UINT_VEC3;
		case TOKEN_UINT_VEC4:		return TYPE_UINT_VEC4;
		case TOKEN_BOOL:			return TYPE_BOOL;
		case TOKEN_BOOL_VEC2:		return TYPE_BOOL_VEC2;
		case TOKEN_BOOL_VEC3:		return TYPE_BOOL_VEC3;
		case TOKEN_BOOL_VEC4:		return TYPE_BOOL_VEC4;
		default:					return TYPE_INVALID;
	}
}